

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1515.c
# Opt level: O0

int test(char *URL)

{
  char *pcVar1;
  undefined8 uVar2;
  int iVar3;
  undefined8 uVar4;
  CURLM *m;
  timeval tVar5;
  char local_268 [8];
  char target_url [256];
  __time_t _Stack_160;
  CURLcode ec;
  __suseconds_t local_158;
  int local_14c;
  int count;
  int i;
  char dns_entry [256];
  char *path;
  char *port;
  char *address;
  int res;
  CURLM *multi;
  char *URL_local;
  
  pcVar1 = libtest_arg3;
  address._4_4_ = 0;
  curl_msnprintf(&count,0x100,"testserver.example.com:%s:%s",libtest_arg3,libtest_arg2);
  tVar5 = tutil_tvnow();
  _Stack_160 = tVar5.tv_sec;
  tv_test_start.tv_sec = _Stack_160;
  local_158 = tVar5.tv_usec;
  tv_test_start.tv_usec = local_158;
  iVar3 = curl_global_init(3);
  uVar2 = _stderr;
  target_url._252_4_ = iVar3;
  if (iVar3 != 0) {
    uVar4 = curl_easy_strerror(iVar3);
    curl_mfprintf(uVar2,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                  ,0x82,iVar3,uVar4);
    address._4_1_ = target_url[0xfc];
    address._5_1_ = target_url[0xfd];
    address._6_1_ = target_url[0xfe];
    address._7_1_ = target_url[0xff];
  }
  if (address._4_4_ == 0) {
    m = (CURLM *)curl_multi_init();
    if (m == (CURLM *)0x0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib1515.c"
                    ,0x83);
      address._4_4_ = 0x7b;
    }
    if (address._4_4_ == 0) {
      for (local_14c = 1; local_14c < 3; local_14c = local_14c + 1) {
        curl_msnprintf(local_268,0x100,"http://testserver.example.com:%s/%s%04d",pcVar1,URL,
                       local_14c);
        address._4_4_ = do_one_request(m,local_268,(char *)&count);
        if (address._4_4_ != 0) break;
        if (local_14c < 2) {
          sleep(2);
        }
      }
    }
    curl_multi_cleanup(m);
    URL_local._4_4_ = address._4_4_;
  }
  else {
    URL_local._4_4_ = address._4_4_;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURLM *multi = NULL;
  int res = 0;
  char *address = libtest_arg2;
  char *port = libtest_arg3;
  char *path = URL;
  char dns_entry[256];
  int i;
  int count = 2;

  snprintf(dns_entry, sizeof(dns_entry), "testserver.example.com:%s:%s",
           port, address);

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);
  multi_init(multi);

  for(i = 1; i <= count; i++) {
    char target_url[256];
    snprintf(target_url, sizeof(target_url),
             "http://testserver.example.com:%s/%s%04d", port, path, i);

    /* second request must succeed like the first one */
    res = do_one_request(multi, target_url, dns_entry);
    if(res)
      goto test_cleanup;

    if(i < count)
      sleep(DNS_TIMEOUT + 1);
  }

test_cleanup:

  curl_multi_cleanup(multi);

  return (int) res;
}